

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

int Abc_NodeIsMuxControlType(Abc_Obj_t *pNode)

{
  int *piVar1;
  void **ppvVar2;
  long *plVar3;
  long *plVar4;
  uint uVar5;
  
  if (((ulong)pNode & 1) == 0) {
    uVar5 = 0;
    if ((pNode->vFanouts).nSize == 2) {
      piVar1 = (pNode->vFanouts).pArray;
      ppvVar2 = pNode->pNtk->vObjs->pArray;
      plVar3 = (long *)ppvVar2[*piVar1];
      if ((*(int *)((long)plVar3 + 0x2c) == 1) &&
         (plVar4 = (long *)ppvVar2[piVar1[1]], *(int *)((long)plVar4 + 0x2c) == 1)) {
        uVar5 = (uint)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                (long)*(int *)plVar3[6] * 8) ==
                      *(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)plVar4[6] * 8));
      }
    }
    return uVar5;
  }
  __assert_fail("!Abc_ObjIsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0x579,"int Abc_NodeIsMuxControlType(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeIsMuxControlType( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode0, * pNode1;
    // check that the node is regular
    assert( !Abc_ObjIsComplement(pNode) );
    // skip the node that do not have two fanouts
    if ( Abc_ObjFanoutNum(pNode) != 2 )
        return 0;
    // get the fanouts
    pNode0 = Abc_ObjFanout( pNode, 0 );
    pNode1 = Abc_ObjFanout( pNode, 1 );
    // if they have more than one fanout, we are not interested
    if ( Abc_ObjFanoutNum(pNode0) != 1 ||  Abc_ObjFanoutNum(pNode1) != 1 )
        return 0;
    // if the fanouts have the same fanout, this is MUX or EXOR (or a redundant gate (CA)(CB))
    return Abc_ObjFanout0(pNode0) == Abc_ObjFanout0(pNode1);
}